

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.cpp
# Opt level: O0

void __thiscall
Mustache::Renderer::readSetDelimiter(Renderer *this,QString *content,int pos,int endPos)

{
  bool bVar1;
  QChar c;
  QString local_b0;
  QChar local_96;
  QChar local_94;
  QChar local_92;
  QChar local_90;
  char16_t local_8e;
  undefined4 local_8c;
  QString local_88;
  QChar local_6a;
  QChar local_68;
  QChar local_66 [10];
  QChar local_52;
  undefined1 local_50 [8];
  QString endMarker;
  QString startMarker;
  int endPos_local;
  int pos_local;
  QString *content_local;
  Renderer *this_local;
  
  QString::QString((QString *)&endMarker.d.size);
  QString::QString((QString *)local_50);
  startMarker.d.size._4_4_ = pos;
  while( true ) {
    local_52 = QString::at(content,(long)startMarker.d.size._4_4_);
    bVar1 = QChar::isSpace(&local_52);
    if (!bVar1 || endPos <= startMarker.d.size._4_4_) break;
    startMarker.d.size._4_4_ = startMarker.d.size._4_4_ + 1;
  }
  while( true ) {
    local_66[0] = QString::at(content,(long)startMarker.d.size._4_4_);
    bVar1 = QChar::isSpace(local_66);
    if (bVar1 || endPos <= startMarker.d.size._4_4_) break;
    local_68 = QString::at(content,(long)startMarker.d.size._4_4_);
    QChar::QChar(&local_6a,'=');
    bVar1 = operator==(local_68,local_6a);
    if (bVar1) {
      QString::QString(&local_88,"Custom delimiters may not contain \'=\'.");
      setError(this,&local_88,startMarker.d.size._4_4_);
      QString::~QString(&local_88);
      local_8c = 1;
      goto LAB_00120a0c;
    }
    local_8e = (char16_t)QString::at(content,(long)startMarker.d.size._4_4_);
    QString::operator+=((QString *)&endMarker.d.size,(QChar)local_8e);
    startMarker.d.size._4_4_ = startMarker.d.size._4_4_ + 1;
  }
  while( true ) {
    local_90 = QString::at(content,(long)startMarker.d.size._4_4_);
    bVar1 = QChar::isSpace(&local_90);
    if (!bVar1 || endPos <= startMarker.d.size._4_4_) break;
    startMarker.d.size._4_4_ = startMarker.d.size._4_4_ + 1;
  }
  do {
    local_92 = QString::at(content,(long)startMarker.d.size._4_4_);
    bVar1 = QChar::isSpace(&local_92);
    if (bVar1 || endPos + -1 <= startMarker.d.size._4_4_) {
      QString::operator=(&this->m_tagStartMarker,(QString *)&endMarker.d.size);
      QString::operator=(&this->m_tagEndMarker,(QString *)local_50);
      local_8c = 0;
LAB_00120a0c:
      QString::~QString((QString *)local_50);
      QString::~QString((QString *)&endMarker.d.size);
      return;
    }
    local_94 = QString::at(content,(long)startMarker.d.size._4_4_);
    QChar::QChar(&local_96,'=');
    bVar1 = operator==(local_94,local_96);
    if (bVar1) {
      QString::QString(&local_b0,"Custom delimiters may not contain \'=\'.");
      setError(this,&local_b0,startMarker.d.size._4_4_);
      QString::~QString(&local_b0);
      local_8c = 1;
      goto LAB_00120a0c;
    }
    c = QString::at(content,(long)startMarker.d.size._4_4_);
    QString::operator+=((QString *)local_50,c);
    startMarker.d.size._4_4_ = startMarker.d.size._4_4_ + 1;
  } while( true );
}

Assistant:

void Renderer::readSetDelimiter(const QString& content, int pos, int endPos)
{
	QString startMarker;
	QString endMarker;

	while (content.at(pos).isSpace() && pos < endPos) {
		++pos;
	}

	while (!content.at(pos).isSpace() && pos < endPos) {
		if (content.at(pos) == '=') {
			setError("Custom delimiters may not contain '='.", pos);
			return;
		}
		startMarker += content.at(pos);
		++pos;
	}

	while (content.at(pos).isSpace() && pos < endPos) {
		++pos;
	}

	while (!content.at(pos).isSpace() && pos < endPos - 1) {
		if (content.at(pos) == '=') {
			setError("Custom delimiters may not contain '='.", pos);
			return;
		}
		endMarker += content.at(pos);
		++pos;
	}

	m_tagStartMarker = startMarker;
	m_tagEndMarker = endMarker;
}